

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

void ** __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::InnerMap::CreateEmptyTable(InnerMap *this,size_type n)

{
  LogMessage *pLVar1;
  ulong uVar2;
  pointer __s;
  MapAllocator<void_*> local_98;
  LogMessage local_90;
  LogMessage local_58;
  
  if (n < 8) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
               ,0x394);
    pLVar1 = internal::LogMessage::operator<<(&local_58,"CHECK failed: n >= kMinTableSize: ");
    internal::LogFinisher::operator=((LogFinisher *)&local_90,pLVar1);
    internal::LogMessage::~LogMessage(&local_58);
  }
  uVar2 = n - (n >> 1 & 0x5555555555555555);
  uVar2 = (uVar2 >> 2 & 0x3333333333333333) + (uVar2 & 0x3333333333333333);
  if (1 < ((uVar2 >> 4) + uVar2 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38) {
    internal::LogMessage::LogMessage
              (&local_90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
               ,0x395);
    pLVar1 = internal::LogMessage::operator<<(&local_90,"CHECK failed: (n & (n - 1)) == (0): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_98,pLVar1);
    internal::LogMessage::~LogMessage(&local_90);
  }
  local_98.arena_ = (this->alloc_).arena_;
  __s = MapAllocator<void_*>::allocate(&local_98,n,(void *)0x0);
  memset(__s,0,n << 3);
  return __s;
}

Assistant:

void** CreateEmptyTable(size_type n) {
      GOOGLE_DCHECK(n >= kMinTableSize);
      GOOGLE_DCHECK_EQ(n & (n - 1), 0);
      void** result = Alloc<void*>(n);
      memset(result, 0, n * sizeof(result[0]));
      return result;
    }